

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O0

ExternalArrayBuffer *
Js::ExternalArrayBuffer::Create(RefCountedBuffer *buffer,uint32 length,DynamicType *type)

{
  ScriptContext *this;
  Recycler *pRVar1;
  ExternalArrayBuffer *this_00;
  TrackAllocData local_48;
  DynamicType *local_20;
  DynamicType *type_local;
  RefCountedBuffer *pRStack_10;
  uint32 length_local;
  RefCountedBuffer *buffer_local;
  
  local_20 = type;
  type_local._4_4_ = length;
  pRStack_10 = buffer;
  this = Js::Type::GetScriptContext(&type->super_Type);
  pRVar1 = ScriptContext::GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
             ,0x4ed);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
  this_00 = (ExternalArrayBuffer *)new<Memory::Recycler>(0x48,pRVar1,0x4642b0);
  ExternalArrayBuffer(this_00,pRStack_10,type_local._4_4_,local_20);
  return this_00;
}

Assistant:

ExternalArrayBuffer* ExternalArrayBuffer::Create(RefCountedBuffer* buffer, uint32 length, DynamicType * type)
    {
        // This type does not own the external memory, so don't AddExternalMemoryUsage like other ArrayBuffer types do
        return RecyclerNewFinalized(type->GetScriptContext()->GetRecycler(), ExternalArrayBuffer, buffer, length, type);
    }